

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isoent_setup_file_location(iso9660_conflict *iso9660,int location)

{
  la_int64_t lVar1;
  int local_4c;
  int local_48;
  int total_block;
  int symlocation;
  int joliet;
  int depth;
  int block;
  size_t size;
  isofile *file;
  isoent *np;
  isoent *isoent;
  iso9660_conflict *piStack_10;
  int location_local;
  iso9660_conflict *iso9660_local;
  
  iso9660->total_file_block = 0;
  np = (iso9660->el_torito).catalog;
  isoent._4_4_ = location;
  piStack_10 = iso9660;
  if (np != (isoent *)0x0) {
    (np->file->content).location = location;
    lVar1 = archive_entry_size(np->file->entry);
    joliet = (int)(lVar1 + 0x7ff >> 0xb);
    isoent._4_4_ = joliet + isoent._4_4_;
    piStack_10->total_file_block = joliet + piStack_10->total_file_block;
  }
  np = (piStack_10->el_torito).boot;
  if (np != (isoent *)0x0) {
    (np->file->content).location = isoent._4_4_;
    _depth = fd_boot_image_size((uint)(piStack_10->el_torito).media_type);
    if (_depth == 0) {
      _depth = archive_entry_size(np->file->entry);
    }
    joliet = (int)_depth + 0x7ff >> 0xb;
    isoent._4_4_ = joliet + isoent._4_4_;
    piStack_10->total_file_block = joliet + piStack_10->total_file_block;
    (np->file->content).blocks = joliet;
  }
  symlocation = 0;
  local_48 = -0x10;
  if ((((uint)piStack_10->opt >> 0x17 & 3) == 0) && (((uint)piStack_10->opt >> 0x11 & 3) != 0)) {
    total_block = 1;
    file = (isofile *)(piStack_10->joliet).rootent;
  }
  else {
    total_block = 0;
    file = (isofile *)(piStack_10->primary).rootent;
  }
  do {
    _isoent_file_location(piStack_10,(isoent *)file,&local_48);
    if (((file->basename).buffer_length == 0) ||
       (((total_block == 0 &&
         ((((uint)piStack_10->opt >> 0x17 & 3) != 0 ||
          ((piStack_10->primary).max_depth <= symlocation + 2)))) &&
        ((((uint)piStack_10->opt >> 0x17 & 3) == 0 ||
         ((piStack_10->primary).max_depth <= symlocation + 1)))))) {
      for (; (archive_entry *)file != file->entry; file = (isofile *)file->entry) {
        if ((file->symlink).length != 0) {
          file = (isofile *)(file->symlink).length;
          break;
        }
        symlocation = symlocation + -1;
      }
    }
    else {
      file = (isofile *)(file->basename).buffer_length;
      symlocation = symlocation + 1;
    }
    if ((archive_entry *)file == file->entry) {
      local_4c = 0;
      for (size = (size_t)(piStack_10->data_file_list).first; size != 0;
          size = *(size_t *)(size + 8)) {
        if (*(int *)(size + 0xb8) != 0) {
          *(size_t *)(size + 0xb0) = size + 0x90;
          do {
            *(uint32_t *)(*(long *)(size + 0xb0) + 0x14) = isoent._4_4_;
            isoent._4_4_ = *(int *)(*(long *)(size + 0xb0) + 0x10) + isoent._4_4_;
            local_4c = *(int *)(*(long *)(size + 0xb0) + 0x10) + local_4c;
            *(undefined8 *)(size + 0xb0) = *(undefined8 *)(*(long *)(size + 0xb0) + 0x18);
          } while (*(long *)(size + 0xb0) != 0);
        }
      }
      piStack_10->total_file_block = local_4c + piStack_10->total_file_block;
      return;
    }
  } while( true );
}

Assistant:

static void
isoent_setup_file_location(struct iso9660 *iso9660, int location)
{
	struct isoent *isoent;
	struct isoent *np;
	struct isofile *file;
	size_t size;
	int block;
	int depth;
	int joliet;
	int symlocation;
	int total_block;

	iso9660->total_file_block = 0;
	if ((isoent = iso9660->el_torito.catalog) != NULL) {
		isoent->file->content.location = location;
		block = (int)((archive_entry_size(isoent->file->entry) +
		    LOGICAL_BLOCK_SIZE -1) >> LOGICAL_BLOCK_BITS);
		location += block;
		iso9660->total_file_block += block;
	}
	if ((isoent = iso9660->el_torito.boot) != NULL) {
		isoent->file->content.location = location;
		size = fd_boot_image_size(iso9660->el_torito.media_type);
		if (size == 0)
			size = (size_t)archive_entry_size(isoent->file->entry);
		block = ((int)size + LOGICAL_BLOCK_SIZE -1)
		    >> LOGICAL_BLOCK_BITS;
		location += block;
		iso9660->total_file_block += block;
		isoent->file->content.blocks = block;
	}

	depth = 0;
	symlocation = -16;
	if (!iso9660->opt.rr && iso9660->opt.joliet) {
		joliet = 1;
		np = iso9660->joliet.rootent;
	} else {
		joliet = 0;
		np = iso9660->primary.rootent;
	}
	do {
		_isoent_file_location(iso9660, np, &symlocation);

		if (np->subdirs.first != NULL &&
		    (joliet ||
		    ((iso9660->opt.rr == OPT_RR_DISABLED &&
		      depth + 2 < iso9660->primary.max_depth) ||
		     (iso9660->opt.rr &&
		      depth + 1 < iso9660->primary.max_depth)))) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);

	total_block = 0;
	for (file = iso9660->data_file_list.first;
	    file != NULL; file = file->datanext) {

		if (!file->write_content)
			continue;

		file->cur_content = &(file->content);
		do {
			file->cur_content->location = location;
			location += file->cur_content->blocks;
			total_block += file->cur_content->blocks;
			/* Next fragment */
			file->cur_content = file->cur_content->next;
		} while (file->cur_content != NULL);
	}
	iso9660->total_file_block += total_block;
}